

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_netstd_struct_tostring
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  reference pptVar4;
  char *pcVar5;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  byte local_181;
  const_iterator cStack_180;
  bool is_required;
  t_field **local_178;
  byte local_169;
  undefined1 local_168 [7];
  bool had_required;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_148
  ;
  t_field **local_140;
  allocator local_131;
  string local_130;
  undefined1 local_110 [8];
  string tmp_count;
  const_iterator cStack_e8;
  bool useFirstFlag;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_b8;
  string local_98;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string tmpvar;
  t_struct *tstruct_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  tmpvar.field_2._8_8_ = tstruct;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"tmp",&local_61);
  t_generator::tmp((string *)local_40,(t_generator *)this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&local_98);
  poVar2 = std::operator<<(poVar2,"public override string ToString()");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_b8);
  poVar2 = std::operator<<(poVar2,"{");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_((string *)&fields,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&fields);
  poVar2 = std::operator<<(poVar2,"var ");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  poVar2 = std::operator<<(poVar2," = new StringBuilder(\"");
  psVar3 = (string *)(**(code **)(*(long *)tmpvar.field_2._8_8_ + 0x18))();
  poVar2 = std::operator<<(poVar2,psVar3);
  poVar2 = std::operator<<(poVar2,"(\");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&fields);
  f_iter._M_current = (t_field **)t_struct::get_members((t_struct *)tmpvar.field_2._8_8_);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&stack0xffffffffffffff18);
  tmp_count.field_2._M_local_buf[0xf] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"tmp",&local_131);
  t_generator::tmp((string *)local_110,(t_generator *)this,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_140 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  cStack_e8 = (const_iterator)local_140;
  local_148._M_current =
       (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
  bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffff18,&local_148);
  if (bVar1) {
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff18);
    bVar1 = field_is_required(*pptVar4);
    if (!bVar1) {
      t_generator::indent_abi_cxx11_((string *)local_168,(t_generator *)this);
      poVar2 = std::operator<<(out,(string *)local_168);
      poVar2 = std::operator<<(poVar2,"int ");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      poVar2 = std::operator<<(poVar2,pcVar5);
      poVar2 = std::operator<<(poVar2," = 0;");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_168);
      tmp_count.field_2._M_local_buf[0xf] = '\x01';
    }
  }
  local_169 = 0;
  local_178 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  cStack_e8 = (const_iterator)local_178;
  while( true ) {
    cStack_180 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffff18,&stack0xfffffffffffffe80);
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff18);
    local_181 = field_is_required(*pptVar4);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff18);
    generate_null_check_begin(this,out,*pptVar4);
    if (((tmp_count.field_2._M_local_buf[0xf] & 1U) == 0) || ((local_169 & 1) != 0)) {
      t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
      poVar2 = std::operator<<(out,(string *)&local_208);
      poVar2 = std::operator<<(poVar2,(string *)local_40);
      poVar2 = std::operator<<(poVar2,".Append(\", ");
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff18);
      prop_name_abi_cxx11_(&local_228,this,*pptVar4,false);
      poVar2 = std::operator<<(poVar2,(string *)&local_228);
      poVar2 = std::operator<<(poVar2,": \");");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_208);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this);
      poVar2 = std::operator<<(out,(string *)&local_1a8);
      poVar2 = std::operator<<(poVar2,"if(0 < ");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      poVar2 = std::operator<<(poVar2,pcVar5);
      pcVar5 = "++";
      if ((local_181 & 1) != 0) {
        pcVar5 = "";
      }
      poVar2 = std::operator<<(poVar2,pcVar5);
      poVar2 = std::operator<<(poVar2,") { ");
      poVar2 = std::operator<<(poVar2,(string *)local_40);
      poVar2 = std::operator<<(poVar2,".Append(\", \"); }");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1a8);
      t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
      poVar2 = std::operator<<(out,(string *)&local_1c8);
      poVar2 = std::operator<<(poVar2,(string *)local_40);
      poVar2 = std::operator<<(poVar2,".Append(\"");
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff18);
      prop_name_abi_cxx11_(&local_1e8,this,*pptVar4,false);
      poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
      poVar2 = std::operator<<(poVar2,": \");");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&local_248);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff18);
    prop_name_abi_cxx11_(&local_268,this,*pptVar4,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_268);
    poVar2 = std::operator<<(poVar2,".ToString(");
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    poVar2 = std::operator<<(poVar2,");");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_248);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff18);
    generate_null_check_end(this,out,*pptVar4);
    if ((local_181 & 1) != 0) {
      local_169 = 1;
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&stack0xffffffffffffff18);
  }
  t_generator::indent_abi_cxx11_(&local_288,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&local_288);
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  poVar2 = std::operator<<(poVar2,".Append(\')\');");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2a8,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_2a8);
  poVar2 = std::operator<<(poVar2,"return ");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  poVar2 = std::operator<<(poVar2,".ToString();");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&local_2c8);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_tostring(ostream& out, t_struct* tstruct)
{
    string tmpvar = tmp("tmp");
    out << indent() << "public override string ToString()" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "var " << tmpvar << " = new StringBuilder(\"" << tstruct->get_name() << "(\");" << endl;

    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    bool useFirstFlag = false;
    string tmp_count = tmp("tmp");
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        if (!field_is_required((*f_iter)))
        {
            out << indent() << "int " << tmp_count.c_str() << " = 0;" << endl;
            useFirstFlag = true;
        }
        break;
    }

    bool had_required = false; // set to true after first required field has been processed

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        bool is_required = field_is_required(*f_iter);
        generate_null_check_begin(out, *f_iter);

        if (useFirstFlag && (!had_required))
        {
            out << indent() << "if(0 < " << tmp_count.c_str() << (is_required ? "" : "++") << ") { " << tmpvar << ".Append(\", \"); }" << endl;
            out << indent() << tmpvar << ".Append(\"" << prop_name(*f_iter) << ": \");" << endl;
        }
        else
        {
            out << indent() << tmpvar << ".Append(\", " << prop_name(*f_iter) << ": \");" << endl;
        }

        out << indent() << prop_name(*f_iter) << ".ToString(" << tmpvar << ");" << endl;

        generate_null_check_end(out, *f_iter);
        if (is_required) {
            had_required = true; // now __count must be > 0, so we don't need to check it anymore
        }
    }

    out << indent() << tmpvar << ".Append(')');" << endl
        << indent() << "return " << tmpvar << ".ToString();" << endl;
    indent_down();
    out << indent() << "}" << endl;
}